

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

void __thiscall Chip8::CPU::run_cycle(CPU *this)

{
  uint8_t uVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint16_t uVar4;
  int iVar5;
  ostream *poVar6;
  int local_84;
  int local_80;
  int i_2;
  int i_1;
  int mod;
  SDL_Event event;
  uint8_t key;
  bool on;
  int j;
  byte local_2f;
  uint8_t sprite_row;
  uint8_t sprite_mask;
  int i;
  bool xored;
  uint uStack_28;
  uint16_t sprite_pointer;
  int n;
  int y;
  int x;
  uint16_t sum;
  uint8_t last_byte;
  uint8_t ry;
  uint8_t rx;
  Address a;
  CPU *pCStack_10;
  OpCode op;
  CPU *this_local;
  
  pCStack_10 = this;
  uVar1 = Memory::getByte(this->_m,(uint)this->_program_counter);
  uVar2 = Memory::getByte(this->_m,this->_program_counter + 1);
  a = CONCAT11(uVar1,uVar2);
  poVar6 = std::operator<<((ostream *)&std::cout,"Operation at 0x");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->_program_counter);
  poVar6 = std::operator<<(poVar6," -> ");
  _sum = std::setw(4);
  poVar6 = std::operator<<(poVar6,_sum);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)a);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  x._2_2_ = a & 0xfff;
  x._1_1_ = a._1_1_ & 0xf;
  x._0_1_ = (byte)a >> 4;
  y._3_1_ = (byte)a;
  uVar3 = a & 0xf000;
  if ((a & 0xf000) == 0) {
    if (a == 0xe0) {
      Graphics::clear(this->_g);
    }
    else if (a == 0xee) {
      this->_program_counter = this->_stack_pointer;
    }
    else {
      Memory::dump(this->_m);
    }
  }
  else if (uVar3 == 0x1000) {
    this->_program_counter = x._2_2_;
  }
  else if (uVar3 == 0x2000) {
    this->_stack_pointer = this->_program_counter + 2;
    this->_program_counter = a & 0xfff;
  }
  else if (uVar3 == 0x3000) {
    if ((ushort)this->_registers[x._1_1_] == (a & 0xff)) {
      this->_program_counter = this->_program_counter + 4;
    }
    else {
      this->_program_counter = this->_program_counter + 2;
    }
  }
  else if (uVar3 == 0x4000) {
    if ((ushort)this->_registers[x._1_1_] == (a & 0xff)) {
      this->_program_counter = this->_program_counter + 2;
    }
    else {
      this->_program_counter = this->_program_counter + 4;
    }
  }
  else if (uVar3 == 0x5000) {
    if (this->_registers[x._1_1_] == this->_registers[(byte)x]) {
      this->_program_counter = this->_program_counter + 4;
    }
    else {
      this->_program_counter = this->_program_counter + 2;
    }
  }
  else if (uVar3 == 0x6000) {
    this->_registers[x._1_1_] = (byte)a;
    this->_program_counter = this->_program_counter + 2;
  }
  else if (uVar3 == 0x7000) {
    this->_registers[x._1_1_] = this->_registers[x._1_1_] + (byte)a;
    this->_program_counter = this->_program_counter + 2;
  }
  else if (uVar3 == 0x8000) {
    switch(a & 0xf) {
    case 0:
      this->_registers[x._1_1_] = this->_registers[(byte)x];
      break;
    case 1:
      this->_registers[x._1_1_] = this->_registers[x._1_1_] | this->_registers[(byte)x];
      break;
    case 2:
      this->_registers[x._1_1_] = this->_registers[x._1_1_] & this->_registers[(byte)x];
      break;
    case 3:
      this->_registers[x._1_1_] = this->_registers[x._1_1_] ^ this->_registers[(byte)x];
      break;
    case 4:
      y._0_2_ = (ushort)this->_registers[x._1_1_] + (ushort)this->_registers[(byte)x];
      this->_registers[0xf] = 0xff < (ushort)y;
      this->_registers[x._1_1_] = (uint8_t)((ulong)(ushort)y % 0xff);
      break;
    case 5:
      this->_registers[0xf] = this->_registers[(byte)x] <= this->_registers[x._1_1_];
      this->_registers[x._1_1_] = this->_registers[x._1_1_] - this->_registers[(byte)x];
      break;
    case 6:
      this->_registers[0xf] = this->_registers[(byte)x] & 1;
      this->_registers[x._1_1_] = (uint8_t)((int)(uint)this->_registers[(byte)x] >> 1);
      break;
    case 7:
      this->_registers[0xf] = this->_registers[x._1_1_] <= this->_registers[(byte)x];
      this->_registers[x._1_1_] = this->_registers[(byte)x] - this->_registers[x._1_1_];
      break;
    case 0xe:
      this->_registers[0xf] = '\0';
      this->_registers[x._1_1_] = this->_registers[(byte)x] << 1;
    }
    this->_program_counter = this->_program_counter + 2;
  }
  else if (uVar3 == 0xa000) {
    this->_index_register = a & 0xfff;
    this->_program_counter = this->_program_counter + 2;
  }
  else if (uVar3 == 0xc000) {
    iVar5 = rand();
    this->_registers[x._1_1_] = (byte)iVar5 & (byte)a;
    this->_program_counter = this->_program_counter + 2;
  }
  else if (uVar3 == 0xd000) {
    n = (int)this->_registers[x._1_1_];
    uStack_28 = (uint)this->_registers[(byte)x];
    i = a & 0xf;
    _sprite_row = this->_index_register;
    local_2f = 0;
    for (j = 0; j < i; j = j + 1) {
      on = true;
      key = Memory::getByte(this->_m,(uint)_sprite_row + j);
      for (event._52_4_ = 0; (int)event._52_4_ < 8; event._52_4_ = event._52_4_ + 1) {
        if ((key & on) != 0) {
          event.padding[0x33] = Graphics::get(this->_g,n + event._52_4_,uStack_28 + j);
          if ((bool)event.padding[0x33]) {
            local_2f = 1;
          }
          Graphics::set(this->_g,n + event._52_4_,uStack_28 + j,
                        (bool)((event.padding[0x33] ^ 0xff) & 1));
        }
        on = SUB41((int)(uint)on >> 1,0);
      }
    }
    this->_registers[0xf] = local_2f & 1;
    this->_program_counter = this->_program_counter + 2;
  }
  else if (uVar3 == 0xe000) {
    if ((byte)a == 0xa1) {
      event.padding[0x32] = this->_registers[x._1_1_];
      while (iVar5 = SDL_PollEvent(&i_1), iVar5 != 0) {
        if ((i_1 == 0x300) &&
           (event.motion.which == *(Uint32 *)(kKeyCodeMap + (ulong)event.padding[0x32] * 4))) {
          poVar6 = std::operator<<((ostream *)&std::cout,"skipping");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          this->_program_counter = this->_program_counter + 2;
        }
      }
    }
    this->_program_counter = this->_program_counter + 2;
  }
  else if (uVar3 == 0xf000) {
    i_2 = 100;
    if ((byte)a == 7) {
      this->_registers[x._1_1_] = this->_delay_timer;
    }
    else if ((byte)a == 0x15) {
      this->_delay_timer = this->_registers[x._1_1_];
    }
    else if ((byte)a == 0x29) {
      uVar4 = Memory::getFontLocation(this->_m);
      this->_index_register = uVar4 + this->_registers[x._1_1_];
    }
    else if ((byte)a == 0x33) {
      for (local_80 = 0; local_80 < 3; local_80 = local_80 + 1) {
        Memory::putByte(this->_m,(uint)this->_index_register + local_80,
                        (uint8_t)((long)(ulong)this->_registers[x._1_1_] % (long)i_2));
        i_2 = i_2 / 10;
      }
    }
    else if ((byte)a == 0x65) {
      for (local_84 = 0; local_84 <= (int)(uint)x._1_1_; local_84 = local_84 + 1) {
        uVar1 = Memory::getByte(this->_m,(uint)this->_index_register + local_84);
        this->_registers[local_84] = uVar1;
      }
    }
    this->_program_counter = this->_program_counter + 2;
  }
  dump(this);
  if (this->_delay_timer != '\0') {
    this->_delay_timer = this->_delay_timer + 0xff;
  }
  if (this->_sound_timer != '\0') {
    this->_sound_timer = this->_sound_timer + 0xff;
  }
  return;
}

Assistant:

void CPU::run_cycle() {
        // Decode instruction
        OpCode op = _m->getByte(_program_counter) << 8 | _m->getByte(_program_counter + 1);

        std::cout << "Operation at 0x"
            << std::hex << _program_counter << " -> " << std::setw(4) << int(op)
            << std::endl;

        Address a = op & kAddressMask;
        uint8_t rx = (op & kRegisterXMask) >> 8;
        uint8_t ry = (op & kRegisterYMask) >> 4;
        uint8_t last_byte = op & 0x0FF;

        // Run instruction
        switch (op & kOpCodeMask) {
            case 0x0000:
                if (op == 0x00E0)
                    // Clear the screen
                    _g->clear();
                else if (op == 0x00EE)
                    // Return from subroutine
                    _program_counter = _stack_pointer;
                else
                    _m->dump();
                break;

            case 0x1000:
                _program_counter = a;
                break;

            case 0x2000:
                _stack_pointer = _program_counter + 2;
                _program_counter = op & 0x0FFF;
                break;

            case 0x3000:
                if (_registers[rx] == (op & kImmediateMask))
                    _program_counter += 4;
                else
                    _program_counter += 2;
                break;

            case 0x4000:
                if (_registers[rx] != (op & kImmediateMask))
                    _program_counter += 4;
                else
                    _program_counter += 2;
                break;

            case 0x5000:
                if (_registers[rx] == _registers[ry])
                    _program_counter += 4;
                else
                    _program_counter += 2;
                break;

            case 0x6000:
                _registers[rx] = (op & kImmediateMask);
                _program_counter += 2;
                break;

            case 0x7000:
                _registers[rx] += (op & kImmediateMask);
                _program_counter += 2;
                break;

            case 0x8000:
                switch (op & kLastNibble) {
                    case 0x0:
                        // Sets VX to the value of VY
                        _registers[rx] = _registers[ry];
                        break;
                    case 0x1:
                        // Sets VX to VX OR VY
                        _registers[rx] |= _registers[ry];
                        break;
                    case 0x2:
                        // Sets VX to VX AND VY
                        _registers[rx] &= _registers[ry];
                        break;
                    case 0x3:
                        // Sets VX to VX XOR VY
                        _registers[rx] ^= _registers[ry];
                        break;
                    case 0x4: {
                        // Adds VY to VX, VF is set to carry
                        uint16_t sum = _registers[rx] + _registers[ry];
                        _registers[0xF] = (sum > 0xFF) ? 1 : 0;
                        _registers[rx] = sum % 0xFF;
                        break;
                    }
                    case 0x5:
                        // VY is subtracted from VX, VF is set to zero when there is a borrow
                        _registers[0xF] = (_registers[ry] > _registers[rx] ? 0 : 1);
                        _registers[rx] -= _registers[ry];
                        break;
                    case 0x6:
                        // Shifts VY right by one and stores the result in VX, VF set to least
                        // significant bit before shift
                        _registers[0xF] = _registers[ry] & 0x0001;
                        _registers[rx] = _registers[ry] >> 1;
                        break;
                    case 0x7:
                        // Sets VX to VY minus VX, VF is set to zero when there is a borrow
                        _registers[0xF] = (_registers[rx] > _registers[ry] ? 0 : 1);
                        _registers[rx] = _registers[ry] - _registers[rx];
                        break;
                    case 0xE:
                        // Shifts VY left by one and stores result in VX, VF set to most
                        // significant bit before shift
                        _registers[0xF] = (_registers[ry] & 0x8000) >> 8;
                        _registers[rx] = _registers[ry] << 1;
                        break;
                }
                _program_counter += 2;
                break;

            case 0xA000:
                _index_register = (op & kAddressMask);
                _program_counter += 2;
                break;

            case 0xC000:
                _registers[rx] = std::rand() & (op & kImmediateMask);
                _program_counter += 2;
                break;

            case 0xD000: {
                int x = _registers[rx];
                int y = _registers[ry];
                int n = (op & kLastNibble);

                uint16_t sprite_pointer = _index_register;
                bool xored = false;

                // Height is determined by the last nibble
                for (int i=0; i < n; i++) {

                    // Chip8 sprites are ALWAYS 8 pixels wide
                    uint8_t sprite_mask = 0x80;
                    uint8_t sprite_row = _m->getByte(sprite_pointer + i);

                    //std::cout << "[cpu] Current sprite pointer: " << (int)sprite_pointer + i << std::endl;
                    //std::cout << "[cpu] Current sprite row: " << (int)sprite_row << std::endl;

                    for (int j=0; j<8; j++) {
                        if (sprite_row & sprite_mask) {
                            bool on = _g->get(x + j, y + i);
                            if (on) xored = true;
                            _g->set(x + j, y + i, !on);
                        }
                        sprite_mask >>= 1;
                    }
                }

                _registers[0x0F] = xored;
                _program_counter += 2;
                break;
            }

            case 0xE000:
                switch (last_byte) {
                    case 0xA1: {
                        // Skip the following instruction if the key corresponding to the hex value
                        // currently stored in register VX is not pressed.
                        uint8_t key = _registers[rx];
                        SDL_Event event;
                        while (SDL_PollEvent(&event)) {
                            if (event.type == SDL_KEYDOWN) {
                                if(event.key.keysym.sym == kKeyCodeMap[key]) {
                                    std::cout << "skipping" << std::endl;
                                    _program_counter += 2;
                                }
                            }
                        }
                    }
                }
                _program_counter += 2;
                break;

            case 0xF000:
                int mod = 100;
                switch (last_byte) {
                    case 0x07:
                        // Store the current value of the delay timer in register VX
                        _registers[rx] = _delay_timer;
                        break;

                    case 0x15:
                        // Set the delay timer to the value of register VX
                        _delay_timer = _registers[rx];
                        break;

                    case 0x29:
                        // Set index register to location of font for hex digit in VX
                        _index_register = _m->getFontLocation() + _registers[rx];
                        break;

                    case 0x33:
                        // Store the binary-coded decimal equivalent of the value stored in
                        // register VX into subsequent memory addresses starting at the address
                        // currently in the index register.
                        for (int i=0; i<3; i++) {
                            _m->putByte(_index_register + i, _registers[rx] % mod);
                            mod /= 10;
                        }
                        break;

                    case 0x65:
                        // Fill registers V0 to VX inclusive with the values stored in memory
                        // starting at the address currently in the index register.
                        for (int i=0; i<=rx; i++)
                            _registers[i] = _m->getByte(_index_register + i);
                        break;
                        // TODO: set index register to index register + x + 1 after this?
                }
                _program_counter += 2;
        }

        // Lets check out what is going on inside the registers of the CPU
        dump();

        // Decrement the timers -- because the timers run at the same clock rate as the CPU
        // itself (60hz) this is totally fine.
        // TODO: skip decrement on cycle when timers are set
        if (_delay_timer > 0) {
            _delay_timer--;
        }

        if (_sound_timer > 0) {
            _sound_timer--;
        }
    }